

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get<double>
          (Attribute *this,double t,double *dst,TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  optional<double> local_30;
  
  if (dst == (double *)0x0) {
    return false;
  }
  if (((!NAN(t)) ||
      ((((this->_var)._blocked == false &&
        (pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar3 = (*pvVar1->type_id)(), uVar3 == 0 ||
        ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))))) ||
     (primvar::PrimVar::get_value<double>(&local_30,&this->_var), local_30.has_value_ == false)) {
    if ((this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->_var)._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = primvar::PrimVar::get_interpolated_value<double>(&this->_var,t,tinterp,dst);
      return bVar2;
    }
    primvar::PrimVar::get_value<double>(&local_30,&this->_var);
    if (local_30.has_value_ == false) {
      return false;
    }
  }
  *dst = (double)local_30.contained;
  return true;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }